

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::xyResolution
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,
          double xPos_mm,double yPos_mm,double A_top)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  RandomGen *pRVar5;
  double dVar6;
  double dVar7;
  double local_58;
  void *local_30 [2];
  long local_20;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar4 = (double *)operator_new(0x10);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar4;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar4;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar4 + 2;
  *pdVar4 = 0.0;
  pdVar4[1] = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar4 + 2;
  (*this->fdetector->_vptr_VDetector[7])
            (SUB84(xPos_mm,0),SUB84(yPos_mm,0),this->fdetector->TopDrift * 0.5,local_30);
  dVar1 = *(double *)((long)local_30[0] + 8);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  dVar1 = (1.0 - dVar1) * A_top;
  dVar7 = yPos_mm * yPos_mm + xPos_mm * xPos_mm;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar2 = this->fdetector->PosResBase;
  dVar3 = exp(this->fdetector->PosResExp * dVar7);
  if (dVar1 < 0.0) {
    dVar6 = sqrt(dVar1);
  }
  else {
    dVar6 = SQRT(dVar1);
  }
  dVar6 = (double)(-(ulong)(150.0 < dVar7) & 0x405d000000000000 |
                  ~-(ulong)(150.0 < dVar7) & (ulong)(dVar3 + dVar2)) / dVar6;
  dVar7 = dVar6 * dVar6 + 9.0;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  pRVar5 = RandomGen::rndm();
  dVar2 = RandomGen::rand_uniform(pRVar5);
  pRVar5 = RandomGen::rndm();
  dVar7 = RandomGen::rand_gauss(pRVar5,0.0,dVar7,false);
  dVar3 = ABS(dVar7);
  local_58 = cos(dVar2 * 6.283185307179586);
  local_58 = local_58 * dVar3;
  dVar2 = sin(dVar2 * 6.283185307179586);
  dVar2 = dVar2 * dVar3;
  if (((((100.0 < dVar3) || (dVar7 == 0.0)) || (100.0 < ABS(local_58))) || (100.0 < ABS(dVar2))) &&
     (40.0 < dVar1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "WARNING: your position resolution is worse than 10 cm. Is that correct?!",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Setting resolution to perfect, for the current event.",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    local_58 = 0.0;
    std::ostream::flush();
    dVar2 = 0.0;
  }
  *pdVar4 = local_58 + xPos_mm;
  pdVar4[1] = dVar2 + yPos_mm;
  return __return_storage_ptr__;
}

Assistant:

vector<double> NESTcalc::xyResolution(double xPos_mm, double yPos_mm,
                                      double A_top) {
  vector<double> xySmeared(2);
  A_top *= 1. - fdetector->FitTBA(xPos_mm, yPos_mm,
                                  fdetector->get_TopDrift() / 2.)[1];

  double rad = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));
  double kappa = fdetector->get_PosResBase() +
                 exp(fdetector->get_PosResExp() * rad);  // arXiv:1710.02752
  if (rad > 150.)
    kappa = 116.;  // see git issue #131 from Claudio: but, converted from cm to
                   // mm here
  double sigmaR = kappa / sqrt(A_top);  // ibid. But only stat; add syst (~3mm)
  sigmaR = sqrt(sigmaR * sigmaR +
                9.);  // σ_vertex^2 = ((r_vertex/r_S2)*σ_(x,y))^2 + σ_sys^2

  double phi = two_PI * RandomGen::rndm()->rand_uniform();
  sigmaR = std::abs(RandomGen::rndm()->rand_gauss(0.0, sigmaR, false));
  double sigmaX = sigmaR * cos(phi);
  double sigmaY = sigmaR * sin(phi);

  if (sigmaR > 1e2 || std::isnan(sigmaR) || sigmaR <= 0. ||
      std::abs(sigmaX) > 1e2 || std::abs(sigmaY) > 1e2) {
    if (A_top >
        40.) {  // roughly three S2 e-'s in most detectors (or ~1.5 in LZ)
      cerr << "WARNING: your position resolution is worse than 10 cm. Is that "
              "correct?!"
           << endl;
      cerr << "Setting resolution to perfect, for the current event." << endl;
      sigmaX = 0.;
      sigmaY = 0.;
    }  // this is only a problem if the area is large and the res is still bad
  }

  xySmeared[0] = xPos_mm + sigmaX;
  xySmeared[1] = yPos_mm + sigmaY;

  return xySmeared;  // new X and Y position in mm with empirical smearing. LUX
                     // Run03 example
}